

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  ImGuiID id;
  int iVar4;
  ImGuiColumns *pIVar5;
  ImGuiColumnData *pIVar6;
  ImGuiColumnData *pIVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ImGuiContext *g;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1db0,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((window->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    __assert_fail("window->DC.CurrentColumns == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1db1,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  id = GetColumnsID(str_id,columns_count);
  pIVar5 = FindOrCreateColumns(window,id);
  if (pIVar5->ID != id) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1db6,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  pIVar5->Current = 0;
  pIVar5->Count = columns_count;
  pIVar5->Flags = flags;
  (window->DC).CurrentColumns = pIVar5;
  pIVar5->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar5->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar2 = (window->ClipRect).Max;
  (pIVar5->HostClipRect).Min = (window->ClipRect).Min;
  (pIVar5->HostClipRect).Max = IVar2;
  IVar2 = (window->WorkRect).Max;
  (pIVar5->HostWorkRect).Min = (window->WorkRect).Min;
  (pIVar5->HostWorkRect).Max = IVar2;
  fVar1 = (pIVar3->Style).ItemSpacing.x;
  fVar14 = (window->WindowPadding).x;
  fVar16 = fVar1 - fVar14;
  fVar14 = fVar14 * 0.5;
  uVar13 = -(uint)(window->WindowBorderSize <= fVar14);
  fVar15 = (window->WorkRect).Max.x;
  fVar16 = (float)(-(uint)(0.0 <= fVar16) & (uint)fVar16);
  fVar19 = (fVar1 + fVar15) - fVar16;
  fVar15 = (float)(int)(float)(~uVar13 & (uint)window->WindowBorderSize | (uint)fVar14 & uVar13) +
           fVar15;
  if (fVar15 <= fVar19) {
    fVar19 = fVar15;
  }
  fVar16 = ((window->DC).Indent.x - fVar1) + fVar16;
  pIVar5->OffMinX = fVar16;
  fVar19 = fVar19 - (window->Pos).x;
  fVar16 = fVar16 + 1.0;
  uVar13 = -(uint)(fVar16 <= fVar19);
  pIVar5->OffMaxX = (float)(~uVar13 & (uint)fVar16 | (uint)fVar19 & uVar13);
  fVar14 = (window->DC).CursorPos.y;
  pIVar5->LineMaxY = fVar14;
  pIVar5->LineMinY = fVar14;
  uVar13 = (pIVar5->Columns).Size;
  uVar8 = columns_count + 1;
  if (uVar13 == uVar8 || uVar13 == 0) {
    pIVar5->IsFirstFrame = uVar13 == 0;
    if (uVar13 != 0) goto LAB_0015d9cf;
    iVar11 = (pIVar5->Columns).Capacity;
  }
  else {
    iVar11 = (pIVar5->Columns).Capacity;
    if (iVar11 < 0) {
      iVar11 = 0;
      pIVar6 = (ImGuiColumnData *)MemAlloc(0);
      pIVar7 = (pIVar5->Columns).Data;
      if (pIVar7 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar6,pIVar7,(long)(pIVar5->Columns).Size * 0x1c);
        MemFree((pIVar5->Columns).Data);
      }
      (pIVar5->Columns).Data = pIVar6;
      (pIVar5->Columns).Capacity = 0;
    }
    (pIVar5->Columns).Size = 0;
    pIVar5->IsFirstFrame = true;
  }
  if (iVar11 <= columns_count) {
    pIVar6 = (ImGuiColumnData *)MemAlloc((ulong)uVar8 * 0x1c);
    pIVar7 = (pIVar5->Columns).Data;
    if (pIVar7 != (ImGuiColumnData *)0x0) {
      memcpy(pIVar6,pIVar7,(long)(pIVar5->Columns).Size * 0x1c);
      MemFree((pIVar5->Columns).Data);
    }
    (pIVar5->Columns).Data = pIVar6;
    (pIVar5->Columns).Capacity = uVar8;
  }
  iVar11 = (pIVar5->Columns).Size;
  uVar13 = 0;
  do {
    if (iVar11 == (pIVar5->Columns).Capacity) {
      if (iVar11 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar11 / 2 + iVar11;
      }
      iVar10 = iVar11 + 1;
      if (iVar11 + 1 < iVar4) {
        iVar10 = iVar4;
      }
      pIVar7 = (ImGuiColumnData *)MemAlloc((long)iVar10 * 0x1c);
      pIVar6 = (pIVar5->Columns).Data;
      if (pIVar6 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar7,pIVar6,(long)(pIVar5->Columns).Size * 0x1c);
        MemFree((pIVar5->Columns).Data);
      }
      (pIVar5->Columns).Data = pIVar7;
      (pIVar5->Columns).Capacity = iVar10;
      iVar11 = (pIVar5->Columns).Size;
    }
    else {
      pIVar7 = (pIVar5->Columns).Data;
    }
    pIVar7[iVar11].OffsetNorm = (float)(int)uVar13 / (float)columns_count;
    pIVar6 = pIVar7 + iVar11;
    pIVar6->OffsetNormBeforeResize = 0.0;
    pIVar6->Flags = 0;
    (((ImRect *)(&pIVar6->OffsetNormBeforeResize + 2))->Min).x = 0.0;
    (((ImRect *)(&pIVar6->OffsetNormBeforeResize + 2))->Min).y = 0.0;
    pIVar7[iVar11].ClipRect.Max.x = 0.0;
    pIVar7[iVar11].ClipRect.Max.y = 0.0;
    iVar11 = (pIVar5->Columns).Size + 1;
    (pIVar5->Columns).Size = iVar11;
    uVar13 = uVar13 + 1;
  } while (uVar8 != uVar13);
LAB_0015d9cf:
  lVar9 = 0xc;
  uVar12 = 0;
  do {
    if ((long)(pIVar5->Columns).Size <= (long)uVar12) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                    ,0x52e,"T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
    }
    pIVar7 = (pIVar5->Columns).Data;
    fVar14 = (window->Pos).x;
    fVar15 = GetColumnOffset((int)uVar12);
    fVar15 = (float)(int)(fVar15 + fVar14 + 0.5);
    fVar14 = (window->Pos).x;
    uVar12 = uVar12 + 1;
    fVar19 = GetColumnOffset((int)uVar12);
    fVar14 = (float)(int)(fVar19 + fVar14 + -1.0 + 0.5);
    *(float *)((long)&pIVar7->OffsetNorm + lVar9) = fVar15;
    *(undefined4 *)((long)&pIVar7->OffsetNormBeforeResize + lVar9) = 0xff7fffff;
    *(float *)((long)&pIVar7->Flags + lVar9) = fVar14;
    *(undefined4 *)((long)&(pIVar7->ClipRect).Min.x + lVar9) = 0x7f7fffff;
    IVar2 = (window->ClipRect).Min;
    fVar19 = IVar2.x;
    fVar16 = IVar2.y;
    uVar13 = -(uint)(fVar19 <= fVar15);
    uVar8 = -(uint)(fVar16 <= -3.4028235e+38);
    *(ulong *)((long)&pIVar7->OffsetNorm + lVar9) =
         CONCAT44(~uVar8 & (uint)fVar16,~uVar13 & (uint)fVar19) |
         CONCAT44(uVar8,(uint)fVar15 & uVar13) & 0xff7fffffffffffff;
    auVar18._8_8_ = 0;
    auVar18._0_4_ = (window->ClipRect).Max.x;
    auVar18._4_4_ = (window->ClipRect).Max.y;
    auVar17._4_4_ = 0x7f7fffff;
    auVar17._0_4_ = fVar14;
    auVar17._8_8_ = 0;
    auVar18 = minps(auVar17,auVar18);
    *(long *)((long)&pIVar7->Flags + lVar9) = auVar18._0_8_;
    lVar9 = lVar9 + 0x1c;
  } while ((uint)columns_count != uVar12);
  if (1 < pIVar5->Count) {
    ImDrawListSplitter::Split(&pIVar5->Splitter,window->DrawList,pIVar5->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar5->Splitter,window->DrawList,1);
    PushColumnClipRect(0);
  }
  fVar14 = GetColumnOffset(pIVar5->Current);
  fVar15 = GetColumnOffset(pIVar5->Current + 1);
  PushItemWidth((fVar15 - fVar14) * 0.65);
  fVar19 = fVar1 - (window->WindowPadding).x;
  fVar19 = (float)(-(uint)(0.0 <= fVar19) & (uint)fVar19);
  (window->DC).ColumnsOffset.x = fVar19;
  fVar14 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar14 + fVar19);
  (window->WorkRect).Max.x = (fVar15 + fVar14) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}